

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chase.cpp
# Opt level: O0

bool move_monst(MonsterThing *tp)

{
  bool bVar1;
  MonsterThing *tp_local;
  
  tp->turn_delay = tp->turn_delay + -1;
  if (tp->turn_delay < 1) {
    tp->turn_delay = 1;
    if ((tp->flags & 0x8000U) != 0) {
      tp->turn_delay = 2;
    }
    bVar1 = do_chase(tp);
    if (bVar1) {
      return true;
    }
  }
  if (((tp->flags & 0x40U) == 0) || (bVar1 = do_chase(tp), !bVar1)) {
    tp_local._7_1_ = false;
  }
  else {
    tp_local._7_1_ = true;
  }
  return tp_local._7_1_;
}

Assistant:

bool move_monst(MonsterThing *tp)
{
    tp->turn_delay--;
    if (tp->turn_delay <= 0)
    {
        tp->turn_delay = 1;
        if (on(*tp, ISSLOW))
            tp->turn_delay = 2;
        if (do_chase(tp))
            return true;
    }
    if (on(*tp, ISHASTE))
        if (do_chase(tp))
            return true;
    return false;
}